

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall GEO::FileSystem::MemoryNode::~MemoryNode(MemoryNode *this)

{
  MemoryNode *this_local;
  
  (this->super_Node).super_Counted._vptr_Counted = (_func_int **)&PTR__MemoryNode_002bae58;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ::~map(&this->files_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>_>_>
  ::~map(&this->subnodes_);
  std::__cxx11::string::~string((string *)&this->path_);
  Node::~Node(&this->super_Node);
  return;
}

Assistant:

class GEOGRAM_API MemoryNode : public Node {
	public:

	    MemoryNode(const std::string& path="/") : path_(path) {
	    }
	    
	    
	    bool copy_file(
		const std::string& from, const std::string& to
	    ) override ;

	    	    
	    std::string load_file_as_string(const std::string& path) override;

	    
	    virtual bool is_file(const std::string& path) override;

	    	    
	    virtual bool is_directory(const std::string& path) override;

	    	    	    
	    virtual bool create_directory(const std::string& path) override;

	    	    	    	    
	    virtual bool delete_directory(const std::string& path) override;

	    
	    virtual bool delete_file(const std::string& path) override;

	    
	    bool get_directory_entries(
		const std::string& path, std::vector<std::string>& result
	    ) override;


	    
	    bool rename_file(
		const std::string& old_name, const std::string& new_name
	    ) override;

	    const char* get_file_contents(const std::string& path);

	    bool create_file(const std::string& path, const char* content);
	    
	protected:
	    static void split_path(
		const std::string& path, std::string& leadingsubdir, 
		std::string& rest
	    );
	    
	private:
	    std::string path_;
	    std::map<std::string, SmartPointer<MemoryNode> > subnodes_;
	    std::map<std::string, const char*> files_;
	}